

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O0

int __thiscall libDAI::TRW::init(TRW *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int extraout_EAX;
  undefined8 uVar2;
  string *in_stack_00000020;
  size_t in_stack_00000028;
  Exception *in_stack_00000030;
  TRW *in_stack_000000b0;
  TRW *in_stack_ffffffffffffffd0;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  uVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0x11])();
  if ((uVar1 & 1) == 0) {
    uVar2 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    Exception::Exception(in_stack_00000030,in_stack_00000028,in_stack_00000020);
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
  init_messages(in_stack_ffffffffffffffd0);
  init_rho_e(in_stack_000000b0);
  return extraout_EAX;
}

Assistant:

void TRW::init() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);
        init_messages();
        init_rho_e();
    }